

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::UdpInputPortDeclSyntax::UdpInputPortDeclSyntax
          (UdpInputPortDeclSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *names)

{
  bool bVar1;
  IdentifierNameSyntax *pIVar2;
  undefined8 uVar3;
  IdentifierNameSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *names_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  UdpInputPortDeclSyntax *this_local;
  Token keyword_local;
  
  uVar3 = keyword._0_8_;
  UdpPortDeclSyntax::UdpPortDeclSyntax(&this->super_UdpPortDeclSyntax,UdpInputPortDecl,attributes);
  (this->keyword).kind = (short)uVar3;
  (this->keyword).field_0x2 = (char)((ulong)uVar3 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar3 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar3 >> 0x20);
  (this->keyword).info = keyword.info;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::SeparatedSyntaxList(&this->names,names);
  (this->names).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::begin(&this->names);
  _child = SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::end(&this->names);
  while( true ) {
    bVar1 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
                          *)&__end2.index,
                         (iterator_base<slang::syntax::IdentifierNameSyntax_*> *)&child);
    if (!bVar1) break;
    pIVar2 = SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
             iterator_base<slang::syntax::IdentifierNameSyntax_*>::operator*
                       ((iterator_base<slang::syntax::IdentifierNameSyntax_*> *)&__end2.index);
    (pIVar2->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_slang::syntax::IdentifierNameSyntax_**,_slang::syntax::IdentifierNameSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

UdpInputPortDeclSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<IdentifierNameSyntax>& names) :
        UdpPortDeclSyntax(SyntaxKind::UdpInputPortDecl, attributes), keyword(keyword), names(names) {
        this->names.parent = this;
        for (auto child : this->names)
            child->parent = this;
    }